

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

HighsStatus __thiscall HEkk::solve(HEkk *this,bool force_phase2)

{
  HighsSimplexInfo *info;
  int iVar1;
  uint uVar2;
  uint uVar3;
  HighsOptions *pHVar4;
  HighsSimplexAnalysis *this_00;
  _Alloc_hider _Var5;
  HighsDebugStatus HVar6;
  HighsStatus HVar7;
  HighsStatus HVar8;
  char *format;
  HEkk *this_01;
  HighsLogOptions *log_options_;
  allocator local_32e1;
  HighsSimplexAnalysis *local_32e0;
  string local_32d8;
  string algorithm_name;
  string local_3298;
  HighsLogOptions local_3278;
  HighsLogOptions local_3218;
  HighsLogOptions local_31b8;
  HEkkPrimal primal_solver_1;
  HEkkPrimal primal_solver;
  
  debugInitialise(this);
  initialiseAnalysis(this);
  initialiseControl(this);
  if ((this->analysis_).analyse_simplex_time == true) {
    HighsSimplexAnalysis::simplexTimerStart(&this->analysis_,0,0);
  }
  this->dual_simplex_cleanup_level_ = 0;
  this->dual_simplex_phase1_cleanup_level_ = 0;
  this->previous_iteration_cycling_detected = -0x7fffffff;
  initialiseForSolve(this);
  std::__cxx11::string::string
            ((string *)&local_3298,"Before HEkk::solve()",(allocator *)&primal_solver);
  HVar6 = HSimplexNla::debugCheckData(&this->simplex_nla_,&local_3298);
  std::__cxx11::string::~string((string *)&local_3298);
  if (HVar6 != kOk) {
    highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kError,
                 "Error in simplex NLA data\n");
    HVar7 = kError;
LAB_0032b4c4:
    returnFromEkkSolve(this,HVar7);
    return HVar7;
  }
  if (this->model_status_ == kOptimal) {
    HVar7 = kOk;
    goto LAB_0032b4c4;
  }
  algorithm_name._M_dataplus._M_p = (pointer)&algorithm_name.field_2;
  algorithm_name._M_string_length = 0;
  algorithm_name.field_2._M_local_buf[0] = '\0';
  this_01 = this;
  clearRayRecords(this);
  info = &this->info_;
  (this->info_).allow_cost_shifting = true;
  (this->info_).allow_cost_perturbation = true;
  (this->info_).allow_bound_perturbation = true;
  chooseSimplexStrategyThreads(this_01,this->options_,info);
  if ((this->info_).simplex_strategy == 4) {
    std::__cxx11::string::assign((char *)&algorithm_name);
    reportSimplexPhaseIterations
              (&(this->options_->super_HighsOptionsStruct).log_options,this->iteration_count_,info,
               true);
    highsLogUser(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,
                 "Using EKK primal simplex solver\n");
    HEkkPrimal::HEkkPrimal(&primal_solver,this);
    HVar7 = HEkkPrimal::solve(&primal_solver,force_phase2);
    HighsLogOptions::HighsLogOptions
              (&local_31b8,&(this->options_->super_HighsOptionsStruct).log_options);
    std::__cxx11::string::string
              ((string *)&primal_solver_1,"HEkkPrimal::solve",(allocator *)&local_32d8);
    HVar7 = interpretCallStatus(&local_31b8,HVar7,kOk,(string *)&primal_solver_1);
    std::__cxx11::string::~string((string *)&primal_solver_1);
    std::_Function_base::~_Function_base(&local_31b8.user_callback.super__Function_base);
    HEkkPrimal::~HEkkPrimal(&primal_solver);
    goto LAB_0032b7bf;
  }
  std::__cxx11::string::assign((char *)&algorithm_name);
  reportSimplexPhaseIterations
            (&(this->options_->super_HighsOptionsStruct).log_options,this->iteration_count_,info,
             true);
  iVar1 = (this->info_).simplex_strategy;
  log_options_ = &(this->options_->super_HighsOptionsStruct).log_options;
  if (iVar1 == 2) {
    format = "Using EKK parallel dual simplex solver - SIP with concurrency of %d\n";
LAB_0032b65b:
    highsLogUser(log_options_,kInfo,format,(ulong)(uint)(this->info_).num_concurrency);
  }
  else {
    if (iVar1 == 3) {
      format = "Using EKK parallel dual simplex solver - PAMI with concurrency of %d\n";
      goto LAB_0032b65b;
    }
    highsLogUser(log_options_,kInfo,"Using EKK dual simplex solver - serial\n");
  }
  HEkkDual::HEkkDual((HEkkDual *)&primal_solver,this);
  HVar7 = HEkkDual::solve((HEkkDual *)&primal_solver,force_phase2);
  HighsLogOptions::HighsLogOptions
            (&local_3218,&(this->options_->super_HighsOptionsStruct).log_options);
  std::__cxx11::string::string
            ((string *)&primal_solver_1,"HEkkDual::solve",(allocator *)&local_32d8);
  HVar7 = interpretCallStatus(&local_3218,HVar7,kOk,(string *)&primal_solver_1);
  std::__cxx11::string::~string((string *)&primal_solver_1);
  std::_Function_base::~_Function_base(&local_3218.user_callback.super__Function_base);
  if ((this->model_status_ == kUnboundedOrInfeasible) &&
     ((this->options_->super_HighsOptionsStruct).allow_unbounded_or_infeasible == false)) {
    HEkkPrimal::HEkkPrimal(&primal_solver_1,this);
    HVar8 = HEkkPrimal::solve(&primal_solver_1,false);
    HighsLogOptions::HighsLogOptions
              (&local_3278,&(this->options_->super_HighsOptionsStruct).log_options);
    std::__cxx11::string::string((string *)&local_32d8,"HEkkPrimal::solve",&local_32e1);
    HVar7 = interpretCallStatus(&local_3278,HVar8,HVar7,&local_32d8);
    std::__cxx11::string::~string((string *)&local_32d8);
    std::_Function_base::~_Function_base(&local_3278.user_callback.super__Function_base);
    HEkkPrimal::~HEkkPrimal(&primal_solver_1);
  }
  HEkkDual::~HEkkDual((HEkkDual *)&primal_solver);
LAB_0032b7bf:
  reportSimplexPhaseIterations
            (&(this->options_->super_HighsOptionsStruct).log_options,this->iteration_count_,info,
             false);
  _Var5 = algorithm_name._M_dataplus;
  if (HVar7 == kError) {
    HVar8 = kError;
  }
  else {
    pHVar4 = this->options_;
    uVar2 = (this->info_).num_primal_infeasibilities;
    uVar3 = (this->info_).num_dual_infeasibilities;
    local_32e0 = &this->analysis_;
    utilModelStatusToString_abi_cxx11_((string *)&primal_solver,this->model_status_);
    highsLogDev(&(pHVar4->super_HighsOptionsStruct).log_options,kInfo,
                "EKK %s simplex solver returns %d primal and %d dual infeasibilities: Status %s\n",
                _Var5._M_p,(ulong)uVar2,(ulong)uVar3,primal_solver.ekk_instance_);
    std::__cxx11::string::~string((string *)&primal_solver);
    this_00 = local_32e0;
    if ((this->analysis_).analyse_simplex_summary_data == true) {
      HighsSimplexAnalysis::summaryReport(local_32e0);
    }
    if ((this->analysis_).analyse_factor_data == true) {
      HighsSimplexAnalysis::reportInvertFormData(this_00);
    }
    HVar8 = HVar7;
    if ((this->analysis_).analyse_factor_time == true) {
      HighsSimplexAnalysis::reportFactorTimer(this_00);
    }
  }
  returnFromEkkSolve(this,HVar8);
  std::__cxx11::string::~string((string *)&algorithm_name);
  return HVar7;
}

Assistant:

HighsStatus HEkk::solve(const bool force_phase2) {
  debugInitialise();

  initialiseAnalysis();
  initialiseControl();

  if (analysis_.analyse_simplex_time)
    analysis_.simplexTimerStart(SimplexTotalClock);
  dual_simplex_cleanup_level_ = 0;
  dual_simplex_phase1_cleanup_level_ = 0;

  previous_iteration_cycling_detected = -kHighsIInf;

  initialiseForSolve();

  const HighsDebugStatus simplex_nla_status =
      simplex_nla_.debugCheckData("Before HEkk::solve()");
  const bool simplex_nla_ok = simplex_nla_status == HighsDebugStatus::kOk;
  if (!simplex_nla_ok) {
    highsLogUser(options_->log_options, HighsLogType::kError,
                 "Error in simplex NLA data\n");
    assert(simplex_nla_ok);
    return returnFromEkkSolve(HighsStatus::kError);
  }

  const bool report_initial_basis = false;
  if (report_initial_basis) debugReportInitialBasis();

  assert(status_.has_basis);
  assert(status_.has_invert);
  assert(status_.initialised_for_solve);
  if (model_status_ == HighsModelStatus::kOptimal)
    return returnFromEkkSolve(HighsStatus::kOk);

  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  std::string algorithm_name;

  // Indicate that dual and primal rays are not known
  this->clearRayRecords();

  // Allow primal and dual perturbations in case a block on them is
  // hanging over from a previous call
  info_.allow_cost_shifting = true;
  info_.allow_cost_perturbation = true;
  info_.allow_bound_perturbation = true;

  chooseSimplexStrategyThreads(*options_, info_);
  HighsInt& simplex_strategy = info_.simplex_strategy;

  // Initial solve according to strategy
  if (simplex_strategy == kSimplexStrategyPrimal) {
    algorithm_name = "primal";
    reportSimplexPhaseIterations(options_->log_options, iteration_count_, info_,
                                 true);
    highsLogUser(options_->log_options, HighsLogType::kInfo,
                 "Using EKK primal simplex solver\n");
    HEkkPrimal primal_solver(*this);
    call_status = primal_solver.solve(force_phase2);
    assert(called_return_from_solve_);
    return_status = interpretCallStatus(options_->log_options, call_status,
                                        return_status, "HEkkPrimal::solve");
  } else {
    algorithm_name = "dual";
    reportSimplexPhaseIterations(options_->log_options, iteration_count_, info_,
                                 true);
    // Solve, depending on the particular strategy
    if (simplex_strategy == kSimplexStrategyDualTasks) {
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   "Using EKK parallel dual simplex solver - SIP with "
                   "concurrency of %d\n",
                   int(info_.num_concurrency));
    } else if (simplex_strategy == kSimplexStrategyDualMulti) {
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   "Using EKK parallel dual simplex solver - PAMI with "
                   "concurrency of %d\n",
                   int(info_.num_concurrency));
    } else {
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   "Using EKK dual simplex solver - serial\n");
    }
    HEkkDual dual_solver(*this);
    call_status = dual_solver.solve(force_phase2);
    assert(called_return_from_solve_);
    return_status = interpretCallStatus(options_->log_options, call_status,
                                        return_status, "HEkkDual::solve");

    // Dual simplex solver may set model_status to be
    // kUnboundedOrInfeasible, and Highs::run() may not allow that to
    // be returned, so use primal simplex to distinguish
    if (model_status_ == HighsModelStatus::kUnboundedOrInfeasible &&
        !options_->allow_unbounded_or_infeasible) {
      HEkkPrimal primal_solver(*this);
      call_status = primal_solver.solve();
      assert(called_return_from_solve_);
      return_status = interpretCallStatus(options_->log_options, call_status,
                                          return_status, "HEkkPrimal::solve");
    }
  }

  reportSimplexPhaseIterations(options_->log_options, iteration_count_, info_);
  if (return_status == HighsStatus::kError)
    return returnFromEkkSolve(return_status);
  highsLogDev(options_->log_options, HighsLogType::kInfo,
              "EKK %s simplex solver returns %" HIGHSINT_FORMAT
              " primal and %" HIGHSINT_FORMAT
              " dual infeasibilities: "
              "Status %s\n",
              algorithm_name.c_str(), info_.num_primal_infeasibilities,
              info_.num_dual_infeasibilities,
              utilModelStatusToString(model_status_).c_str());
  // Can model_status_ = HighsModelStatus::kNotset be returned?
  assert(model_status_ != HighsModelStatus::kNotset);

  if (analysis_.analyse_simplex_summary_data) analysis_.summaryReport();
  if (analysis_.analyse_factor_data) analysis_.reportInvertFormData();
  if (analysis_.analyse_factor_time) analysis_.reportFactorTimer();
  return returnFromEkkSolve(return_status);
}